

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

void Bmc_CexPrint(Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  uint uVar1;
  ulong uVar2;
  char *__format;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = pCex->nRegs;
  Abc_CexPrintStatsInputs(pCex,nInputs);
  if (fVerbose != 0) {
    if (nInputs < 1) {
      nInputs = 0;
    }
    for (uVar5 = 0; (int)uVar5 <= pCex->iFrame; uVar5 = uVar5 + 1) {
      uVar6 = 0;
      uVar2 = (ulong)uVar5;
      __format = "%3d : ";
      iVar3 = nInputs;
      while( true ) {
        printf(__format,uVar2);
        bVar7 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar7) break;
        bVar7 = ((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0;
        uVar2 = (ulong)bVar7;
        uVar6 = uVar6 + bVar7;
        uVar1 = uVar1 + 1;
        __format = "%d";
      }
      uVar4 = 0;
      printf(" %3d ",(ulong)uVar6);
      for (iVar3 = nInputs; iVar3 < pCex->nPis; iVar3 = iVar3 + 1) {
        bVar7 = ((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0;
        uVar4 = uVar4 + bVar7;
        uVar1 = uVar1 + 1;
        printf("%d",(ulong)bVar7);
      }
      printf(" %3d\n",(ulong)uVar4);
    }
    if (uVar1 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                    ,0x14c,"void Bmc_CexPrint(Abc_Cex_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Bmc_CexPrint( Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    int i, k, Count, iBit = pCex->nRegs;
    Abc_CexPrintStatsInputs( pCex, nInputs );
    if ( !fVerbose )
        return;

    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Count = 0;
        printf( "%3d : ", i );
        for ( k = 0; k < nInputs; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d ", Count );
        Count = 0;
        for (      ; k < pCex->nPis; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d\n", Count );
    }
    assert( iBit == pCex->nBits );
}